

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
NLReaderTest_WriteBinaryHeader_Test::TestBody(NLReaderTest_WriteBinaryHeader_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  undefined1 auVar3 [16];
  long lVar4;
  AssertionResult gtest_ar;
  MemoryWriter w;
  AssertHelper AStack_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  internal local_370 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  Writer local_360;
  Buffer<char> local_350;
  char local_330 [496];
  long lStack_140;
  NLHeader local_138;
  
  memset(&local_138,0,0x110);
  local_138.super_NLInfo.super_NLInfo_C.format = 1;
  local_138.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_138.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_138.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_138.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  lVar2 = 0x17;
  auVar3 = _DAT_0025c030;
  do {
    lVar4 = auVar3._8_8_;
    if (SUB164(auVar3 ^ _DAT_0025c040,4) == -0x80000000 &&
        SUB164(auVar3 ^ _DAT_0025c040,0) < -0x7ffffffd) {
      (&lStack_140)[lVar2] = (auVar3._0_8_ + 1) * 0xb;
      *(long *)(&local_138.super_NLProblemInfo.super_NLProblemInfo_C.num_vars + lVar2 * 2) =
           (lVar4 + 1) * 0xb;
    }
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x1b);
  local_138.super_NLInfo.super_NLInfo_C.arith_kind = 5;
  local_138.super_NLInfo.super_NLInfo_C.flags = 1;
  local_360.buffer_ = &local_350;
  local_360._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002f1120;
  local_350.size_ = 0;
  local_350.capacity_ = 500;
  local_350._vptr_Buffer = (_func_int **)&PTR_grow_002f1168;
  local_350.ptr_ = local_330;
  mp::operator<<(&local_360,&local_138);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,(local_360.buffer_)->ptr_,
             (local_360.buffer_)->ptr_ + (local_360.buffer_)->size_);
  testing::internal::CmpHelperEQ<char[92],std::__cxx11::string>
            (local_370,
             "\"b3 11 22 33\\n\" \" 0 0 0 0 0 0\\n\" \" 0 0 0 0 0 0\\n\" \" 0 0\\n\" \" 0 0 0\\n\" \" 0 0 5 0\\n\" \" 0 0 0 0 0\\n\" \" 0 0\\n\" \" 0 0\\n\" \" 0 0 0 0 0\\n\""
             ,"w.str()",
             (char (*) [92])
             "b3 11 22 33\n 0 0 0 0 0 0\n 0 0 0 0 0 0\n 0 0\n 0 0 0\n 0 0 5 0\n 0 0 0 0 0\n 0 0\n 0 0\n 0 0 0 0 0\n"
             ,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_390);
    if (local_368.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_368.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x355,message);
    testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&AStack_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_390._M_dataplus._M_p + 8))();
      }
      local_390._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_368,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_360._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002f1120;
  local_350._vptr_Buffer = (_func_int **)&PTR_grow_002f1168;
  if (local_350.ptr_ != local_330) {
    operator_delete(local_350.ptr_,local_350.capacity_);
  }
  return;
}

Assistant:

TEST(NLReaderTest, WriteBinaryHeader) {
  NLHeader header = NLHeader();
  header.format = NLHeader::BINARY;
  header.num_ampl_options = 3;
  for (int i = 0; i < header.num_ampl_options; ++i)
    header.ampl_options[i] = 11 * (i + 1);
  header.arith_kind = (NLArithKind)mp::arith::CRAY;
  fmt::MemoryWriter w;
  w << header;
  EXPECT_EQ(
      "b3 11 22 33\n"
      " 0 0 0 0 0 0\n"
      " 0 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0 0\n"
      " 0 0 5 0\n"
      " 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0\n"
      " 0 0 0 0 0\n",
      w.str());
}